

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.h
# Opt level: O2

string * __thiscall
str::concat<char_const(&)[1],std::__cxx11::string_const&>
          (string *__return_storage_ptr__,str *this,string_view delimiter,char (*arg) [1],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_00;
  string_view delimiter_00;
  ostringstream stream;
  ostringstream aoStack_1a8 [376];
  
  delimiter_00._M_len = delimiter._M_len;
  arg_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)arg;
  std::__cxx11::ostringstream::ostringstream(aoStack_1a8);
  std::operator<<((ostream *)aoStack_1a8,delimiter._M_str);
  delimiter_00._M_str = *arg;
  _concat<std::__cxx11::string_const&>((str *)aoStack_1a8,(ostringstream *)this,delimiter_00,arg_00)
  ;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string concat(std::string_view delimiter, Arg&& arg, Args&&... args) {
        static_assert(sizeof...(Args) > 0, "This function needs at least 2 parameters");

        std::ostringstream stream;
        stream << arg;
        _concat(stream, delimiter, std::forward<Args>(args)...);
        return stream.str();
    }